

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
embree::XMLLoader::loadFloatArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  long *in_RDX;
  string *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float fVar4;
  size_t i;
  vector<float,_std::allocator<float>_> *data;
  Ref<embree::XML> *in_stack_00000198;
  XMLLoader *in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  vector<float,_std::allocator<float>_> *this_00;
  XML *in_stack_ffffffffffffff68;
  ulong uVar5;
  ulong __n;
  undefined1 in_stack_ffffffffffffff77;
  Token *in_stack_ffffffffffffff78;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  long *local_38;
  long *local_20;
  long *local_18;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x370a62);
  }
  else {
    this_00 = (vector<float,_std::allocator<float>_> *)*in_RDX;
    local_38 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"ofs",&local_79);
    XML::parm(in_stack_ffffffffffffff68,in_RSI);
    bVar1 = std::operator!=(in_stack_ffffffffffffff20,
                            (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if ((bVar1 & 1) == 0) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x370b8b);
      local_18 = local_38;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_38 + 0x98));
      std::vector<float,_std::allocator<float>_>::resize
                (this_00,CONCAT17(bVar1,in_stack_ffffffffffffff38));
      uVar5 = 0;
      while (__n = uVar5, sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI),
            uVar5 < sVar2) {
        local_20 = local_38;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_38 + 0x98),__n);
        fVar4 = Token::Float(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,__n);
        *pvVar3 = fVar4;
        uVar5 = __n + 1;
      }
    }
    else {
      loadBinary<std::vector<float,std::allocator<float>>>(in_stack_000001a0,in_stack_00000198);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<float> XMLLoader::loadFloatArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<float>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<float>>(xml);
    } 
    else 
    {
      std::vector<float> data;
      data.resize(xml->body.size());
      for (size_t i=0; i<data.size(); i++) 
        data[i] = xml->body[i].Float();
      return data;
    }
  }